

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall
DataFilters::StringFilter::StringFilter
          (StringFilter *this,string *pattern,bool *isExact,bool *isSensitive,bool *isAccept)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  bool *isAccept_local;
  bool *isSensitive_local;
  bool *isExact_local;
  string *pattern_local;
  StringFilter *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)pattern);
  this->_isExact = (bool)(*isExact & 1);
  this->_isSensitive = (bool)(*isSensitive & 1);
  this->_isAccept = (bool)(*isAccept & 1);
  if ((*isSensitive & 1U) == 0) {
    __first._M_current = (char *)std::__cxx11::string::begin((string *)this);
    __last._M_current = (char *)std::__cxx11::string::end((string *)this);
    __result._M_current = (char *)std::__cxx11::string::begin((string *)this);
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
              (__first,__last,__result,toupper);
  }
  return;
}

Assistant:

StringFilter(std::string const & pattern,
                     bool const & isExact = true,
                     bool const & isSensitive = true,
                     bool const & isAccept = true) :
                        _pattern(pattern),
                        _isExact(isExact),
                        _isSensitive(isSensitive),
                        _isAccept(isAccept)
        {
            if (!isSensitive)
            {
                std::transform(this->_pattern.begin(), this->_pattern.end(), this->_pattern.begin(), ::toupper);
            }
        }